

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_asn1_uint64_with_tag(CBS *cbs,uint64_t *out,CBS_ASN1_TAG tag)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int is_negative;
  CBS bytes;
  int local_24;
  CBS local_20;
  
  iVar2 = cbs_get_asn1(cbs,&local_20,tag,1);
  uVar5 = 0;
  if (iVar2 != 0) {
    iVar2 = CBS_is_valid_asn1_integer(&local_20,&local_24);
    uVar5 = 0;
    if ((iVar2 != 0) && (local_24 == 0)) {
      *out = 0;
      bVar8 = local_20.len == 0;
      if ((!bVar8) && (*out >> 0x38 == 0)) {
        uVar3 = *out;
        uVar6 = 0;
        do {
          *out = uVar3 << 8;
          uVar7 = (ulong)local_20.data[uVar6] | uVar3 << 8;
          *out = uVar7;
          uVar1 = uVar6 + 1;
          if (local_20.len - 1 == uVar6) break;
          uVar4 = uVar3 >> 0x30;
          uVar3 = uVar7;
          uVar6 = uVar1;
        } while (uVar4 == 0);
        bVar8 = local_20.len <= uVar1;
      }
      uVar5 = (uint)bVar8;
    }
  }
  return uVar5;
}

Assistant:

int CBS_get_asn1_uint64_with_tag(CBS *cbs, uint64_t *out, CBS_ASN1_TAG tag) {
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_unsigned_asn1_integer(&bytes)) {
    return 0;
  }

  *out = 0;
  const uint8_t *data = CBS_data(&bytes);
  size_t len = CBS_len(&bytes);
  for (size_t i = 0; i < len; i++) {
    if ((*out >> 56) != 0) {
      // Too large to represent as a uint64_t.
      return 0;
    }
    *out <<= 8;
    *out |= data[i];
  }

  return 1;
}